

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O2

void __thiscall gimage::TIFFImageIO::save(TIFFImageIO *this,ImageFloat *image,char *name)

{
  float ***pppfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  int iVar7;
  long lVar8;
  IOException *pIVar9;
  ulong uVar10;
  ulong uVar11;
  pointer pfVar12;
  ulong uVar13;
  long lVar14;
  long k;
  ulong uVar15;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<float,_std::allocator<float>_> line;
  
  lVar8 = TIFFOpen(name,"w");
  if (lVar8 == 0) {
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_68,name,(allocator *)&line);
    std::operator+(&local_88,"Cannot store image: ",&local_68);
    gutil::IOException::IOException(pIVar9,&local_88);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  TIFFSetField(lVar8,0x100,(int)image->width);
  TIFFSetField(lVar8,0x101,(int)image->height);
  TIFFSetField(lVar8,0x115,(short)image->depth);
  TIFFSetField(lVar8,0x102,0x20);
  TIFFSetField(lVar8,0x153,3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)image->depth * image->width * 4;
  auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x2000);
  uVar5 = SUB164(auVar3 / auVar2,0);
  if (uVar5 < 2) {
    uVar5 = 1;
  }
  uVar4 = (uint)image->height;
  if ((int)uVar5 < (int)uVar4) {
    uVar4 = uVar5;
  }
  uVar6 = TIFFDefaultStripSize(lVar8,uVar4,SUB168(auVar3 % auVar2,0));
  TIFFSetField(lVar8,0x116,uVar6);
  TIFFSetField(lVar8,0x112,1);
  TIFFSetField(lVar8,0x11c,1);
  TIFFSetField(lVar8,0x106,(image->depth - 3U < 2) + '\x01');
  if ((long)image->depth == 1) {
    uVar15 = 0;
    while ((long)uVar15 < image->height) {
      iVar7 = TIFFWriteScanline(lVar8,(*image->img)[uVar15],uVar15 & 0xffffffff,0);
      uVar15 = uVar15 + 1;
      if (iVar7 < 0) {
        TIFFClose(lVar8);
        pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_68,name,(allocator *)&line);
        std::operator+(&local_88,"Cannot write image data: ",&local_68);
        gutil::IOException::IOException(pIVar9,&local_88);
        __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
      }
    }
  }
  else {
    std::vector<float,_std::allocator<float>_>::vector
              (&line,(long)image->depth * image->width,(allocator_type *)&local_88);
    uVar15 = 0;
    while ((long)uVar15 < image->height) {
      uVar10 = (ulong)(uint)image->depth;
      if (image->depth < 1) {
        uVar10 = 0;
      }
      uVar11 = image->width;
      if (image->width < 1) {
        uVar11 = 0;
      }
      pfVar12 = line.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (uVar13 = 0; uVar13 != uVar11; uVar13 = uVar13 + 1) {
        pppfVar1 = image->img;
        for (lVar14 = 0; uVar10 * 4 != lVar14; lVar14 = lVar14 + 4) {
          *(undefined4 *)((long)pfVar12 + lVar14) =
               *(undefined4 *)
                (*(long *)(*(long *)((long)pppfVar1 + lVar14 * 2) + uVar15 * 8) + uVar13 * 4);
        }
        pfVar12 = (pointer)((long)pfVar12 + lVar14);
      }
      iVar7 = TIFFWriteScanline(lVar8,line.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                      .super__Vector_impl_data._M_start,uVar15 & 0xffffffff,0);
      uVar15 = uVar15 + 1;
      if (iVar7 < 0) {
        TIFFClose(lVar8);
        pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_68,name,&local_89);
        std::operator+(&local_88,"Cannot write image data: ",&local_68);
        gutil::IOException::IOException(pIVar9,&local_88);
        __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
      }
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&line.super__Vector_base<float,_std::allocator<float>_>);
  }
  TIFFClose(lVar8);
  return;
}

Assistant:

void TIFFImageIO::save(const ImageFloat &image, const char *name) const
{
  saveInternal(image, name);
}